

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonBlobMakeEditable(JsonParse *pParse,u32 nExtra)

{
  u8 *__src;
  int iVar1;
  
  iVar1 = 0;
  if (pParse->oom == '\0') {
    if (pParse->nBlobAlloc == 0) {
      __src = pParse->aBlob;
      pParse->aBlob = (u8 *)0x0;
      iVar1 = jsonBlobExpand(pParse,nExtra + pParse->nBlob);
      if (iVar1 != 0) {
        return 0;
      }
      memcpy(pParse->aBlob,__src,(ulong)pParse->nBlob);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int jsonBlobMakeEditable(JsonParse *pParse, u32 nExtra){
  u8 *aOld;
  u32 nSize;
  assert( !pParse->bReadOnly );
  if( pParse->oom ) return 0;
  if( pParse->nBlobAlloc>0 ) return 1;
  aOld = pParse->aBlob;
  nSize = pParse->nBlob + nExtra;
  pParse->aBlob = 0;
  if( jsonBlobExpand(pParse, nSize) ){
    return 0;
  }
  assert( pParse->nBlobAlloc >= pParse->nBlob + nExtra );
  memcpy(pParse->aBlob, aOld, pParse->nBlob);
  return 1;
}